

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_DDict *
ZSTD_createDDict_advanced
          (void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_customMem customMem)

{
  ZSTD_customMem customMem_00;
  uint uVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  ZSTD_DDict *in_RSI;
  size_t in_stack_00000008;
  long in_stack_00000010;
  size_t initResult;
  ZSTD_DDict *ddict;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 *puVar2;
  ZSTD_dictContentType_e in_stack_ffffffffffffffd0;
  ZSTD_dictLoadMethod_e in_stack_ffffffffffffffd4;
  ZSTD_DDict *local_8;
  
  puVar2 = &stack0x00000008;
  if ((in_stack_00000008 == 0) == (in_stack_00000010 == 0)) {
    customMem_00.customFree = (ZSTD_freeFunction)puVar2;
    customMem_00.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffc0;
    customMem_00.opaque._0_4_ = in_stack_ffffffffffffffd0;
    customMem_00.opaque._4_4_ = in_stack_ffffffffffffffd4;
    local_8 = (ZSTD_DDict *)ZSTD_customMalloc(in_stack_00000008,customMem_00);
    if (local_8 == (ZSTD_DDict *)0x0) {
      local_8 = (ZSTD_DDict *)0x0;
    }
    else {
      (local_8->cMem).customAlloc = (ZSTD_allocFunction)*puVar2;
      (local_8->cMem).customFree = (ZSTD_freeFunction)puVar2[1];
      (local_8->cMem).opaque = (void *)puVar2[2];
      ZSTD_initDDict_internal
                (in_RSI,(void *)CONCAT44(in_EDX,in_ECX),(size_t)local_8,in_stack_ffffffffffffffd4,
                 in_stack_ffffffffffffffd0);
      uVar1 = ZSTD_isError(0x2869fc);
      if (uVar1 != 0) {
        ZSTD_freeDDict(local_8);
        local_8 = (ZSTD_DDict *)0x0;
      }
    }
  }
  else {
    local_8 = (ZSTD_DDict *)0x0;
  }
  return local_8;
}

Assistant:

ZSTD_DDict* ZSTD_createDDict_advanced(const void* dict, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType,
                                      ZSTD_customMem customMem)
{
    if ((!customMem.customAlloc) ^ (!customMem.customFree)) return NULL;

    {   ZSTD_DDict* const ddict = (ZSTD_DDict*) ZSTD_customMalloc(sizeof(ZSTD_DDict), customMem);
        if (ddict == NULL) return NULL;
        ddict->cMem = customMem;
        {   size_t const initResult = ZSTD_initDDict_internal(ddict,
                                            dict, dictSize,
                                            dictLoadMethod, dictContentType);
            if (ZSTD_isError(initResult)) {
                ZSTD_freeDDict(ddict);
                return NULL;
        }   }
        return ddict;
    }
}